

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPIToolchains.cxx
# Opt level: O2

Value * cmFileAPIToolchainsDump
                  (Value *__return_storage_ptr__,cmFileAPI *fileAPI,unsigned_long version)

{
  undefined8 *puVar1;
  int iVar2;
  Value *pVVar3;
  Value *this;
  undefined1 *__a;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  ToolchainVariable *in_R8;
  long lVar4;
  cmMakefile *mf;
  initializer_list<(anonymous_namespace)::ToolchainVariable> __l;
  initializer_list<(anonymous_namespace)::ToolchainVariable> __l_00;
  allocator<char> local_210;
  allocator<char> local_20f;
  allocator<char> local_20e;
  allocator<char> local_20d;
  allocator<char> local_20c;
  allocator<char> local_20b;
  allocator<char> local_20a;
  allocator<char> local_209;
  Value *local_208;
  string *local_200;
  string *local_1f8;
  string *local_1f0;
  string *local_1e8;
  string *local_1e0;
  allocator_type *local_1d8;
  string *local_1d0;
  string *local_1c8;
  cmMakefile *local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  Value local_1a0;
  undefined1 local_178 [64];
  bool local_138;
  string local_130 [32];
  string local_110 [32];
  undefined1 local_f0;
  string local_e8 [32];
  string local_c8 [32];
  undefined1 local_a8;
  string local_a0 [32];
  string local_80 [32];
  undefined1 local_60;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_1a0,arrayValue);
  local_208 = __return_storage_ptr__;
  cmState::GetEnabledLanguages_abi_cxx11_
            (&local_1b8,
             (fileAPI->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  local_1c0 = (cmMakefile *)
              local_1b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_1f8 = local_130;
  local_1e0 = local_e8;
  local_1c8 = local_c8;
  local_1f0 = local_a0;
  local_1d0 = local_80;
  local_200 = local_130;
  __a = local_e8;
  local_1e8 = local_a0;
  local_1d8 = (allocator_type *)__a;
  for (mf = (cmMakefile *)
            local_1b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start; mf != local_1c0;
      mf = (cmMakefile *)
           &(mf->FindPackageRootPathStack).
            super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_last) {
    if ((anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
        CompilerVariables == '\0') {
      iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::Toolchains::
                                   DumpToolchain(std::__cxx11::string_const&)::CompilerVariables);
      if (iVar2 != 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)local_178,"path",&local_210);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_178 + 0x20),"COMPILER",&local_209);
        local_138 = false;
        std::__cxx11::string::string<std::allocator<char>>(local_130,"id",&local_20a);
        std::__cxx11::string::string<std::allocator<char>>(local_110,"COMPILER_ID",&local_20b);
        local_f0 = 0;
        std::__cxx11::string::string<std::allocator<char>>(local_1e0,"version",&local_20c);
        std::__cxx11::string::string<std::allocator<char>>(local_1c8,"COMPILER_VERSION",&local_20d);
        local_a8 = 0;
        std::__cxx11::string::string<std::allocator<char>>(local_1f0,"target",&local_20e);
        std::__cxx11::string::string<std::allocator<char>>(local_1d0,"COMPILER_TARGET",&local_20f);
        local_60 = 0;
        __l._M_len = extraout_RDX;
        __l._M_array = (iterator)local_178;
        std::
        vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
        ::vector((vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
                  *)(anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                    CompilerVariables,__l,(allocator_type *)__a);
        lVar4 = 0xd8;
        do {
          anon_unknown.dwarf_13b920e::ToolchainVariable::~ToolchainVariable
                    ((ToolchainVariable *)(local_178 + lVar4));
          lVar4 = lVar4 + -0x48;
        } while (lVar4 != -0x48);
        __cxa_atexit(std::
                     vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
                     ::~vector,
                     (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                     CompilerVariables,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::Toolchains::
                             DumpToolchain(std::__cxx11::string_const&)::CompilerVariables);
      }
    }
    if ((anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
        CompilerImplicitVariables == '\0') {
      iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::Toolchains::
                                   DumpToolchain(std::__cxx11::string_const&)::
                                   CompilerImplicitVariables);
      if (iVar2 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_178,"includeDirectories",&local_210);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_178 + 0x20),"IMPLICIT_INCLUDE_DIRECTORIES",&local_209);
        local_138 = true;
        std::__cxx11::string::string<std::allocator<char>>(local_130,"linkDirectories",&local_20a);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_110,"IMPLICIT_LINK_DIRECTORIES",&local_20b);
        local_f0 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1d8,"linkFrameworkDirectories",&local_20c);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1c8,"IMPLICIT_LINK_FRAMEWORK_DIRECTORIES",&local_20d);
        local_a8 = 1;
        std::__cxx11::string::string<std::allocator<char>>(local_1e8,"linkLibraries",&local_20e);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1d0,"IMPLICIT_LINK_LIBRARIES",&local_20f);
        local_60 = 1;
        __l_00._M_len = extraout_RDX_00;
        __l_00._M_array = (iterator)local_178;
        std::
        vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
        ::vector((vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
                  *)(anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                    CompilerImplicitVariables,__l_00,(allocator_type *)__a);
        lVar4 = 0xd8;
        do {
          anon_unknown.dwarf_13b920e::ToolchainVariable::~ToolchainVariable
                    ((ToolchainVariable *)(local_178 + lVar4));
          lVar4 = lVar4 + -0x48;
        } while (lVar4 != -0x48);
        __cxa_atexit(std::
                     vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
                     ::~vector,
                     (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                     CompilerImplicitVariables,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::Toolchains::
                             DumpToolchain(std::__cxx11::string_const&)::CompilerImplicitVariables);
      }
    }
    if ((anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
        SourceFileExtensionsVariable == '\0') {
      iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::Toolchains::
                                   DumpToolchain(std::__cxx11::string_const&)::
                                   SourceFileExtensionsVariable);
      if (iVar2 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                   SourceFileExtensionsVariable,"sourceFileExtensions",(allocator<char> *)local_178)
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   ((anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                    SourceFileExtensionsVariable + 0x20),"SOURCE_FILE_EXTENSIONS",&local_210);
        (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
        SourceFileExtensionsVariable[0x40] = 1;
        __cxa_atexit(anon_unknown.dwarf_13b920e::ToolchainVariable::~ToolchainVariable,
                     (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                     SourceFileExtensionsVariable,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::Toolchains::
                             DumpToolchain(std::__cxx11::string_const&)::
                             SourceFileExtensionsVariable);
      }
    }
    puVar1 = *(undefined8 **)
              &(((fileAPI->CMakeInstance->GlobalGenerator)._M_t.
                 super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                 .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->Makefiles).
               super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
    ;
    Json::Value::Value((Value *)&stack0xffffffffffffffa8,objectValue);
    Json::Value::Value((Value *)local_178,(String *)mf);
    pVVar3 = Json::Value::operator[]((Value *)&stack0xffffffffffffffa8,"language");
    Json::Value::operator=(pVVar3,(Value *)local_178);
    Json::Value::~Value((Value *)local_178);
    anon_unknown.dwarf_13b920e::Toolchains::DumpToolchainVariables
              ((Value *)local_178,(Toolchains *)*puVar1,mf,
               (string *)
               (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
               CompilerVariables,
               (vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
                *)in_R8);
    pVVar3 = Json::Value::operator[]((Value *)&stack0xffffffffffffffa8,"compiler");
    Json::Value::operator=(pVVar3,(Value *)local_178);
    Json::Value::~Value((Value *)local_178);
    anon_unknown.dwarf_13b920e::Toolchains::DumpToolchainVariables
              ((Value *)local_178,(Toolchains *)*puVar1,mf,
               (string *)
               (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
               CompilerImplicitVariables,
               (vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
                *)in_R8);
    pVVar3 = Json::Value::operator[]((Value *)&stack0xffffffffffffffa8,"compiler");
    pVVar3 = Json::Value::operator[](pVVar3,"implicit");
    Json::Value::operator=(pVVar3,(Value *)local_178);
    Json::Value::~Value((Value *)local_178);
    __a = (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
          SourceFileExtensionsVariable;
    anon_unknown.dwarf_13b920e::Toolchains::DumpToolchainVariable
              ((Toolchains *)*puVar1,(cmMakefile *)&stack0xffffffffffffffa8,(Value *)mf,
               (string *)
               (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
               SourceFileExtensionsVariable,in_R8);
    Json::Value::append(&local_1a0,(Value *)&stack0xffffffffffffffa8);
    Json::Value::~Value((Value *)&stack0xffffffffffffffa8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b8);
  pVVar3 = local_208;
  this = Json::Value::operator[](local_208,"toolchains");
  Json::Value::operator=(this,&local_1a0);
  Json::Value::~Value(&local_1a0);
  return pVVar3;
}

Assistant:

Json::Value cmFileAPIToolchainsDump(cmFileAPI& fileAPI, unsigned long version)
{
  Toolchains toolchains(fileAPI, version);
  return toolchains.Dump();
}